

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

size_t MOJOSHADER_printFloat(char *text,size_t maxlen,float arg)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  char *local_68;
  float local_5c;
  char *local_58;
  int local_4c;
  int mult;
  unsigned_long value;
  int precision;
  char *textstart;
  size_t left;
  size_t len;
  float arg_local;
  size_t maxlen_local;
  char *text_local;
  
  value._4_4_ = 9;
  if (NAN(arg)) {
    if (3 < maxlen) {
      snprintf(text,maxlen,"NaN");
    }
    maxlen_local = (size_t)(text + 3);
  }
  else {
    iVar2 = 1;
    if ((int)arg < 0) {
      iVar2 = -1;
    }
    iVar1 = 0;
    if ((float)((uint)arg & (uint)DAT_0014c0e0) == INFINITY) {
      iVar1 = iVar2;
    }
    if (iVar1 == 0) {
      if ((arg != 0.0) || (NAN(arg))) {
        textstart = (char *)maxlen;
        len._4_4_ = arg;
        maxlen_local = (size_t)text;
        if (arg < 0.0) {
          if (1 < maxlen) {
            *text = '-';
            textstart = (char *)(maxlen - 1);
          }
          maxlen_local = (size_t)(text + 1);
          len._4_4_ = -arg;
        }
        uVar3 = (long)len._4_4_ | (long)(len._4_4_ - 9.223372e+18) & (long)len._4_4_ >> 0x3f;
        iVar2 = snprintf((char *)maxlen_local,(size_t)textstart,"%lu",uVar3);
        pcVar4 = (char *)(long)iVar2;
        if (pcVar4 < textstart) {
          textstart = textstart + -(long)pcVar4;
        }
        else {
          if (textstart == (char *)0x0) {
            local_58 = textstart;
          }
          else {
            local_58 = (char *)0x1;
          }
          textstart = local_58;
        }
        local_5c = (float)uVar3;
        len._4_4_ = len._4_4_ - local_5c;
        local_4c = 10;
        if ((char *)0x1 < textstart) {
          pcVar4[maxlen_local] = '.';
          textstart = textstart + -1;
        }
        maxlen_local = (size_t)(pcVar4 + maxlen_local + 1);
        while (0 < value._4_4_) {
          uVar3 = (ulong)(len._4_4_ * (float)local_4c);
          uVar3 = uVar3 | (long)(len._4_4_ * (float)local_4c - 9.223372e+18) & (long)uVar3 >> 0x3f;
          iVar2 = snprintf((char *)maxlen_local,(size_t)textstart,"%lu",uVar3);
          pcVar4 = (char *)(long)iVar2;
          maxlen_local = (size_t)(pcVar4 + maxlen_local);
          if (pcVar4 < textstart) {
            textstart = textstart + -(long)pcVar4;
          }
          else {
            if (textstart == (char *)0x0) {
              local_68 = textstart;
            }
            else {
              local_68 = (char *)0x1;
            }
            textstart = local_68;
          }
          auVar5._8_4_ = (int)(uVar3 >> 0x20);
          auVar5._0_8_ = uVar3;
          auVar5._12_4_ = 0x45300000;
          len._4_4_ = (float)((double)len._4_4_ -
                             ((auVar5._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                             (double)local_4c);
          if (len._4_4_ < 0.0) {
            len._4_4_ = -len._4_4_;
          }
          local_4c = local_4c * 10;
          value._4_4_ = value._4_4_ + -1;
        }
      }
      else {
        if (3 < maxlen) {
          snprintf(text,maxlen,"0.0");
        }
        maxlen_local = (size_t)(text + 3);
      }
    }
    else {
      if (3 < maxlen) {
        snprintf(text,maxlen,"inf");
      }
      maxlen_local = (size_t)(text + 3);
    }
  }
  return maxlen_local - (long)text;
}

Assistant:

size_t MOJOSHADER_printFloat(char *text, size_t maxlen, float arg)
{
    size_t len;
    size_t left = maxlen;
    char *textstart = text;

    int precision = 9;

    if (isnan(arg))
    {
        if (left > 3)
        {
            snprintf(text, left, "NaN");
            left -= 3;
        } // if
        text += 3;
    } // if
    else if (isinf(arg))
    {
        if (left > 3)
        {
            snprintf(text, left, "inf");
            left -= 3;
        } // if
        text += 3;
    } // else if
    else if (arg)
    {
        /* This isn't especially accurate, but hey, it's easy. :) */
        unsigned long value;

        if (arg < 0)
        {
            if (left > 1)
            {
                *text = '-';
                --left;
            } // if
            ++text;
            arg = -arg;
        } // if
        value = (unsigned long) arg;
        len = snprintf(text, left, "%lu", value);
        text += len;
        if (len >= left)
            left = (left < 1) ? left : 1;
        else
            left -= len;
        arg -= value;

        int mult = 10;
        if (left > 1)
        {
            *text = '.';
            --left;
        } // if
        ++text;
        while (precision-- > 0)
        {
            value = (unsigned long) (arg * mult);
            len = snprintf(text, left, "%lu", value);
            text += len;
            if (len >= left)
                left = (left < 1) ? left : 1;
            else
                left -= len;
            arg -= (double) value / mult;
            if (arg < 0) arg = -arg; // Sometimes that bit gets flipped...
            mult *= 10;
        } // while
    } // if
    else
    {
        if (left > 3)
        {
            snprintf(text, left, "0.0");
            left -= 3;
        } // if
        text += 3;
    } // else

    return (text - textstart);
}